

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,int *size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Lit p;
  Lit *pLVar4;
  Lit *pLVar5;
  Clause *local_90;
  int local_6c;
  int j;
  int i;
  Lit *__qs;
  Lit *__ps;
  Clause *qs;
  Clause *ps;
  bool ps_smallest;
  int *size_local;
  Var v_local;
  Clause *_qs_local;
  Clause *_ps_local;
  SimpSolver *this_local;
  
  this->merges = this->merges + 1;
  iVar2 = Clause::size(_ps);
  iVar3 = Clause::size(_qs);
  local_90 = _qs;
  if (iVar2 < iVar3) {
    local_90 = _ps;
    _ps = _qs;
  }
  pLVar4 = Clause::operator_cast_to_Lit_(_ps);
  pLVar5 = Clause::operator_cast_to_Lit_(local_90);
  iVar2 = Clause::size(_ps);
  *size = iVar2 + -1;
  j = 0;
  do {
    iVar2 = Clause::size(local_90);
    if (iVar2 <= j) {
      return true;
    }
    iVar2 = var((Lit)pLVar5[j].x);
    if (iVar2 != v) {
      for (local_6c = 0; iVar2 = Clause::size(_ps), local_6c < iVar2; local_6c = local_6c + 1) {
        iVar2 = var((Lit)pLVar4[local_6c].x);
        iVar3 = var((Lit)pLVar5[j].x);
        if (iVar2 == iVar3) {
          p = operator~(pLVar5[j].x);
          bVar1 = Lit::operator==(pLVar4 + local_6c,p);
          if (bVar1) {
            return false;
          }
          goto LAB_0011f6a6;
        }
      }
      *size = *size + 1;
    }
LAB_0011f6a6:
    j = j + 1;
  } while( true );
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, int& size)
{
    merges++;

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;
    const Lit*  __ps  = (const Lit*)ps;
    const Lit*  __qs  = (const Lit*)qs;

    size = ps.size()-1;

    for (int i = 0; i < qs.size(); i++){
        if (var(__qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(__ps[j]) == var(__qs[i])){
                    if (__ps[j] == ~__qs[i])
                        return false;
                    else
                        goto next;
                }
            size++;
        }
        next:;
    }

    return true;
}